

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboApiTests.cpp
# Opt level: O2

void deqp::gles3::Functional::attachmentQueryDefaultFboTest(TestContext *testCtx,Context *ctx)

{
  GLenum GVar1;
  GLenum expectA;
  GLenum expectA_00;
  GLenum expectA_01;
  GLenum expectA_02;
  GLint unused;
  undefined4 local_1c;
  
  local_1c = 0xffffffff;
  GVar1 = 0x8cd0;
  (*ctx->_vptr_Context[0x22])(ctx,0x8d40,0x8ce0,0x8cd0,&local_1c);
  checkEitherError(testCtx,ctx,expectA,GVar1);
  GVar1 = 0x8cd1;
  (*ctx->_vptr_Context[0x22])(ctx,0x8d40,0x8ce0,0x8cd1,&local_1c);
  checkEitherError(testCtx,ctx,expectA_00,GVar1);
  GVar1 = 0x8cd2;
  (*ctx->_vptr_Context[0x22])(ctx,0x8d40,0x8ce0,0x8cd2,&local_1c);
  checkEitherError(testCtx,ctx,expectA_01,GVar1);
  GVar1 = 0x8cd3;
  (*ctx->_vptr_Context[0x22])(ctx,0x8d40,0x8ce0,0x8cd3,&local_1c);
  checkEitherError(testCtx,ctx,expectA_02,GVar1);
  return;
}

Assistant:

static void attachmentQueryDefaultFboTest (tcu::TestContext& testCtx, sglr::Context& ctx)
{
	// Check that proper error codes are returned
	GLint unused = -1;
	ctx.getFramebufferAttachmentParameteriv(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE, &unused);
	checkEitherError(testCtx, ctx, GL_INVALID_ENUM, GL_INVALID_OPERATION);
	ctx.getFramebufferAttachmentParameteriv(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_FRAMEBUFFER_ATTACHMENT_OBJECT_NAME, &unused);
	checkEitherError(testCtx, ctx, GL_INVALID_ENUM, GL_INVALID_OPERATION);
	ctx.getFramebufferAttachmentParameteriv(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_FRAMEBUFFER_ATTACHMENT_TEXTURE_LEVEL, &unused);
	checkEitherError(testCtx, ctx, GL_INVALID_ENUM, GL_INVALID_OPERATION);
	ctx.getFramebufferAttachmentParameteriv(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_FRAMEBUFFER_ATTACHMENT_TEXTURE_CUBE_MAP_FACE, &unused);
	checkEitherError(testCtx, ctx, GL_INVALID_ENUM, GL_INVALID_OPERATION);
}